

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_force_close(intptr_t uuid)

{
  undefined1 *puVar1;
  char cVar2;
  undefined8 *ptr;
  int __epfd;
  fio_data_s *pfVar3;
  int iVar4;
  undefined8 *puVar5;
  long lVar6;
  int *piVar7;
  uint __fd;
  char *pcVar8;
  fio_packet_s *tmp;
  long lVar9;
  fio_lock_i ret;
  epoll_event local_48;
  
  pfVar3 = fio_data;
  if ((-1 < uuid) && (__fd = (uint)((ulong)uuid >> 8), __fd < fio_data->capa)) {
    lVar9 = (long)(int)__fd * 0xa8;
    if (*(char *)((long)fio_data + lVar9 + 0x6d) == (char)uuid) {
      if (*(char *)((long)fio_data + lVar9 + 0x70) == '\0') {
        *(undefined1 *)((long)fio_data + lVar9 + 0x70) = 1;
      }
      LOCK();
      pcVar8 = (char *)((long)pfVar3 + lVar9 + 0x6e);
      cVar2 = *pcVar8;
      *pcVar8 = '\x01';
      UNLOCK();
      if (cVar2 != '\0') {
        pcVar8 = (char *)((long)pfVar3 + lVar9 + 0x6e);
        do {
          local_48.events = 0;
          local_48._4_4_ = 0;
          local_48.data.u64 = 1;
          nanosleep((timespec *)&local_48,(timespec *)0x0);
          LOCK();
          cVar2 = *pcVar8;
          *pcVar8 = '\x01';
          UNLOCK();
        } while (cVar2 != '\0');
      }
      pfVar3 = fio_data;
      puVar5 = (undefined8 *)((long)fio_data + lVar9 + 0x40);
      ptr = (undefined8 *)*puVar5;
      *puVar5 = 0;
      *(undefined8 **)((long)pfVar3 + lVar9 + 0x48) = puVar5;
      *(undefined8 *)((long)pfVar3 + lVar9 + 0x50) = 0;
      LOCK();
      puVar1 = (undefined1 *)((long)pfVar3 + lVar9 + 0x6e);
      local_48.events._0_1_ = *puVar1;
      *puVar1 = 0;
      UNLOCK();
      while (ptr != (undefined8 *)0x0) {
        puVar5 = (undefined8 *)*ptr;
        (*(code *)ptr[2])(ptr[3]);
        fio_free(ptr);
        ptr = puVar5;
      }
      if (((*(char *)((long)fio_data + lVar9 + 0x6f) != '\0') &&
          ((*(byte *)((long)fio_data + lVar9 + 0x70) & 1) != 0)) &&
         (lVar6 = (**(code **)(*(long *)((long)fio_data + lVar9 + 0xa8) + 0x18))(uuid),
         pfVar3 = fio_data, lVar6 != 0)) {
        *(undefined1 *)((long)fio_data + lVar9 + 0x70) = 2;
        if ((__fd < pfVar3->capa) && (*(char *)((long)pfVar3 + lVar9 + 0x6d) == (char)uuid)) {
          *(__time_t *)((long)pfVar3 + lVar9 + 0x60) = (pfVar3->last_cycle).tv_sec;
        }
        __epfd = evio_fd[2];
        piVar7 = __errno_location();
        do {
          *piVar7 = 0;
          local_48._4_4_ = __fd;
          local_48.events = 0x40002014;
          iVar4 = epoll_ctl(__epfd,3,__fd,&local_48);
          if ((iVar4 == -1) && (*piVar7 == 2)) {
            *piVar7 = 0;
            local_48.events = 0x40002014;
            epoll_ctl(__epfd,1,__fd,&local_48);
          }
        } while (*piVar7 == 4);
        return;
      }
      pfVar3 = fio_data;
      LOCK();
      pcVar8 = (char *)((long)fio_data + lVar9 + 0x6c);
      cVar2 = *pcVar8;
      *pcVar8 = '\x01';
      UNLOCK();
      local_48.events._0_1_ = cVar2;
      if (cVar2 != '\0') {
        pcVar8 = (char *)((long)pfVar3 + lVar9 + 0x6c);
        do {
          local_48.events = 0;
          local_48._4_4_ = 0;
          local_48.data.u64 = 1;
          nanosleep((timespec *)&local_48,(timespec *)0x0);
          LOCK();
          cVar2 = *pcVar8;
          *pcVar8 = '\x01';
          UNLOCK();
          local_48.events._0_1_ = cVar2;
        } while (cVar2 != '\0');
      }
      fio_clear_fd((long)(int)__fd,'\0');
      LOCK();
      puVar1 = (undefined1 *)((long)fio_data + lVar9 + 0x6c);
      local_48.events._0_1_ = *puVar1;
      *puVar1 = 0;
      UNLOCK();
      close(__fd);
      if (fio_data->connection_count == 0) {
        return;
      }
      LOCK();
      fio_data->connection_count = fio_data->connection_count - 1;
      UNLOCK();
      return;
    }
  }
  piVar7 = __errno_location();
  *piVar7 = 9;
  return;
}

Assistant:

void fio_force_close(intptr_t uuid) {
  if (!uuid_is_valid(uuid)) {
    errno = EBADF;
    return;
  }
  // FIO_LOG_DEBUG("fio_force_close called for uuid %p", (void *)uuid);
  /* make sure the close marker is set */
  if (!uuid_data(uuid).close)
    uuid_data(uuid).close = 1;
  /* clear away any packets in case we want to cut the connection short. */
  fio_packet_s *packet = NULL;
  fio_lock(&uuid_data(uuid).sock_lock);
  packet = uuid_data(uuid).packet;
  uuid_data(uuid).packet = NULL;
  uuid_data(uuid).packet_last = &uuid_data(uuid).packet;
  uuid_data(uuid).sent = 0;
  fio_unlock(&uuid_data(uuid).sock_lock);
  while (packet) {
    fio_packet_s *tmp = packet;
    packet = packet->next;
    fio_packet_free(tmp);
  }
  /* check for rw-hooks termination packet */
  if (uuid_data(uuid).open && (uuid_data(uuid).close & 1) &&
      uuid_data(uuid).rw_hooks->before_close(uuid, uuid_data(uuid).rw_udata)) {
    uuid_data(uuid).close = 2; /* don't repeat the before_close callback */
    fio_touch(uuid);
    fio_poll_add_write(fio_uuid2fd(uuid));
    return;
  }
  fio_lock(&uuid_data(uuid).protocol_lock);
  fio_clear_fd(fio_uuid2fd(uuid), 0);
  fio_unlock(&uuid_data(uuid).protocol_lock);
  close(fio_uuid2fd(uuid));
#if FIO_ENGINE_POLL
  fio_poll_remove_fd(fio_uuid2fd(uuid));
#endif
  if (fio_data->connection_count)
    fio_atomic_sub(&fio_data->connection_count, 1);
}